

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_signal.c
# Opt level: O0

void block_signal(int sig,_Bool block_it)

{
  int iVar1;
  undefined1 local_90 [8];
  sigset_t ss;
  _Bool block_it_local;
  int sig_local;
  
  ss.__val[0xf]._3_1_ = block_it;
  ss.__val[0xf]._4_4_ = sig;
  sigemptyset((sigset_t *)local_90);
  sigaddset((sigset_t *)local_90,ss.__val[0xf]._4_4_);
  iVar1 = sigprocmask((uint)((ss.__val[0xf]._3_1_ & 1) == 0),(sigset_t *)local_90,(sigset_t *)0x0);
  if (iVar1 < 0) {
    perror("sigprocmask");
    exit(1);
  }
  return;
}

Assistant:

void block_signal(int sig, bool block_it)
{
    sigset_t ss;

    sigemptyset(&ss);
    sigaddset(&ss, sig);
    if(sigprocmask(block_it ? SIG_BLOCK : SIG_UNBLOCK, &ss, 0) < 0) {
        perror("sigprocmask");
        exit(1);
    }
}